

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mplayer.c
# Opt level: O0

monst * mk_mplayer(permonst *ptr,level *lev,xchar x,xchar y,boolean special)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  obj *otmp_00;
  int local_cc;
  char local_ac;
  int local_9c;
  uchar local_94;
  short local_90;
  short local_8c;
  short local_88;
  short local_84;
  monst *local_80;
  obj *local_70;
  obj *otmp;
  int quan;
  short local_5c;
  short shield;
  short helm;
  short cloak;
  short armor;
  short weapon;
  char nam [32];
  monst *local_30;
  monst *mtmp;
  boolean special_local;
  xchar y_local;
  xchar x_local;
  level *lev_local;
  permonst *ptr_local;
  
  if ((ptr < mons + 0x159) || (mons + 0x168 < ptr)) {
    ptr_local = (permonst *)0x0;
  }
  else {
    if ((lev->monsters[x][y] != (monst *)0x0) &&
       ((*(uint *)&lev->monsters[x][y]->field_0x60 >> 9 & 1) == 0)) {
      if ((lev->monsters[x][y] == (monst *)0x0) ||
         ((*(uint *)&lev->monsters[x][y]->field_0x60 >> 9 & 1) != 0)) {
        local_80 = (monst *)0x0;
      }
      else {
        local_80 = lev->monsters[x][y];
      }
      rloc(lev,local_80,'\0');
    }
    mtmp._5_1_ = special;
    if (u.uz.dnum != dungeon_topology.d_astral_level.dnum) {
      mtmp._5_1_ = '\0';
    }
    local_30 = makemon(ptr,lev,(int)x,(int)y,0);
    if (local_30 != (monst *)0x0) {
      iVar1 = rn2(2);
      if (iVar1 == 0) {
        iVar1 = rnd_class(10,0x41);
        local_84 = (short)iVar1;
      }
      else {
        local_84 = 0x26;
      }
      shield = local_84;
      iVar1 = rnd_class(0x54,0x5d);
      local_5c = (short)iVar1;
      iVar1 = rn2(8);
      if (iVar1 == 0) {
        local_88 = 0;
      }
      else {
        iVar1 = rnd_class(0x80,0x87);
        local_88 = (short)iVar1;
      }
      quan._2_2_ = local_88;
      iVar1 = rn2(8);
      if (iVar1 == 0) {
        local_8c = 0;
      }
      else {
        iVar1 = rnd_class(0x48,0x53);
        local_8c = (short)iVar1;
      }
      quan._0_2_ = local_8c;
      iVar1 = rn2(8);
      if (iVar1 == 0) {
        local_90 = 0;
      }
      else {
        iVar1 = rnd_class(0x89,0x8e);
        local_90 = (short)iVar1;
      }
      otmp._6_2_ = local_90;
      if (mtmp._5_1_ == '\0') {
        iVar1 = rnd(0x10);
        local_94 = (uchar)iVar1;
      }
      else {
        iVar1 = rn2(0x10);
        local_94 = (char)iVar1 + '\x0f';
      }
      local_30->m_lev = local_94;
      iVar1 = dice((uint)local_30->m_lev,10);
      if (mtmp._5_1_ == '\0') {
        local_9c = 0x1e;
      }
      else {
        local_9c = rnd(0x1e);
        local_9c = local_9c + 0x1e;
      }
      local_30->mhpmax = iVar1 + local_9c;
      local_30->mhp = iVar1 + local_9c;
      if (mtmp._5_1_ != '\0') {
        get_mplname(local_30,(char *)&helm);
        local_30 = christen_monst(local_30,(char *)&helm);
        mongets(local_30,0xd8);
      }
      *(uint *)&local_30->field_0x60 = *(uint *)&local_30->field_0x60 & 0xffbfffff;
      set_malign(local_30);
      iVar1 = monsndx(ptr);
      switch(iVar1) {
      case 0x159:
        iVar1 = rn2(2);
        if (iVar1 != 0) {
          shield = 0x41;
        }
        break;
      case 0x15a:
        iVar1 = rn2(2);
        if (iVar1 != 0) {
          iVar1 = rn2(2);
          shield = 0x1c;
          if (iVar1 != 0) {
            shield = 0x27;
          }
          otmp._6_2_ = 0;
        }
        iVar1 = rn2(2);
        if (iVar1 != 0) {
          iVar1 = rnd_class(0x6a,0x71);
          local_5c = (short)iVar1;
        }
        if (local_8c == 0x51) {
          quan._0_2_ = 0;
        }
        break;
      case 0x15b:
      case 0x15c:
        iVar1 = rn2(4);
        if (iVar1 == 0) {
          iVar1 = rn2(2);
          if (iVar1 != 0) {
            shield = 0x3c;
          }
        }
        else {
          shield = 0x39;
        }
        if (local_8c == 0x51) {
          quan._0_2_ = 0;
        }
        break;
      case 0x15d:
        break;
      case 0x15e:
        iVar1 = rn2(4);
        if (iVar1 == 0) {
          iVar1 = rn2(2);
          if (iVar1 != 0) {
            iVar1 = rn2(2);
            shield = 0x16;
            if (iVar1 != 0) {
              shield = 0x10a;
            }
          }
        }
        else {
          shield = 0x3e;
        }
        iVar1 = rn2(4);
        if (iVar1 != 0) {
          iVar1 = rn2(2);
          quan._0_2_ = 0x53;
          if (iVar1 != 0) {
            quan._0_2_ = 0x51;
          }
        }
        iVar1 = rn2(2);
        if (iVar1 != 0) {
          otmp._6_2_ = 0;
        }
        break;
      case 0x15f:
        iVar1 = rn2(4);
        if (iVar1 != 0) {
          shield = 0x26;
        }
        iVar1 = rn2(2);
        if (iVar1 != 0) {
          iVar1 = rnd_class(0x6a,0x71);
          local_5c = (short)iVar1;
        }
        break;
      case 0x160:
        shield = 0;
        local_5c = 0;
        quan._2_2_ = 0x81;
        iVar1 = rn2(2);
        if (iVar1 != 0) {
          otmp._6_2_ = 0;
        }
        break;
      case 0x161:
      case 0x162:
        iVar1 = rn2(2);
        if (iVar1 != 0) {
          shield = 0x39;
        }
        iVar1 = rn2(2);
        if (iVar1 != 0) {
          iVar1 = rnd_class(0x6a,0x71);
          local_5c = (short)iVar1;
        }
        iVar1 = rn2(4);
        if (iVar1 != 0) {
          quan._2_2_ = 0x81;
        }
        iVar1 = rn2(4);
        if (iVar1 != 0) {
          iVar1 = rn2(2);
          quan._0_2_ = 0x53;
          if (iVar1 != 0) {
            quan._0_2_ = 0x51;
          }
        }
        iVar1 = rn2(2);
        if (iVar1 != 0) {
          otmp._6_2_ = 0;
        }
        break;
      case 0x163:
        iVar1 = rn2(2);
        if (iVar1 != 0) {
          shield = 0x12;
        }
        break;
      case 0x164:
        iVar1 = rn2(2);
        if (iVar1 != 0) {
          shield = 0x1d;
        }
        break;
      case 0x165:
        iVar1 = rn2(2);
        if (iVar1 != 0) {
          shield = 0x28;
        }
        break;
      case 0x166:
        break;
      case 0x167:
        iVar1 = rn2(2);
        if (iVar1 != 0) {
          shield = 0x3b;
        }
        iVar1 = rn2(2);
        if (iVar1 != 0) {
          iVar1 = rnd_class(0x6a,0x71);
          local_5c = (short)iVar1;
        }
        break;
      case 0x168:
        iVar1 = rn2(4);
        if (iVar1 != 0) {
          iVar1 = rn2(2);
          shield = 0x15;
          if (iVar1 != 0) {
            shield = 0x3e;
          }
        }
        iVar1 = rn2(2);
        if (iVar1 != 0) {
          iVar1 = rn2(2);
          local_5c = 0x55;
          if (iVar1 != 0) {
            local_5c = 0x59;
          }
          quan._2_2_ = 0x86;
        }
        iVar1 = rn2(4);
        if (iVar1 != 0) {
          quan._0_2_ = 0x51;
        }
        otmp._6_2_ = 0;
        break;
      default:
        uVar2 = monsndx(ptr);
        warning("bad mplayer monster: %d",(ulong)uVar2);
        shield = 0;
      }
      if (shield != 0) {
        local_70 = mksobj(lev,(int)shield,'\x01','\0');
        if (mtmp._5_1_ == '\0') {
          iVar1 = rn2(4);
          local_ac = (char)iVar1;
        }
        else {
          iVar1 = rn2(5);
          local_ac = (char)iVar1 + '\x04';
        }
        local_70->spe = local_ac;
        iVar1 = rn2(3);
        if (iVar1 == 0) {
          *(uint *)&local_70->field_0x4a = *(uint *)&local_70->field_0x4a & 0xffffefff | 0x1000;
        }
        else {
          iVar1 = rn2(2);
          if (iVar1 == 0) {
            *(uint *)&local_70->field_0x4a = *(uint *)&local_70->field_0x4a & 0xffefffff | 0x100000;
          }
        }
        if (mtmp._5_1_ != '\0') {
          iVar1 = rn2(5);
          if (iVar1 == 0) {
            local_70 = mk_artifact(lev,local_70,-0x80);
          }
          else {
            local_70 = create_oprop(lev,local_70,'\0');
          }
        }
        if (local_70->oartifact == '\n') {
          iVar1 = rnd(4);
          local_70->spe = (schar)iVar1;
        }
        mpickobj(local_30,local_70);
      }
      if (mtmp._5_1_ != '\0') {
        iVar1 = rn2(10);
        if (iVar1 == 0) {
          iVar3 = rn2(3);
          iVar1 = 0x210;
          if (iVar3 != 0) {
            iVar1 = 0x20f;
          }
          mongets(local_30,iVar1);
        }
        mk_mplayer_armor(local_30,local_5c);
        mk_mplayer_armor(local_30,quan._2_2_);
        mk_mplayer_armor(local_30,(short)quan);
        mk_mplayer_armor(local_30,otmp._6_2_);
        iVar1 = rn2(8);
        if (iVar1 != 0) {
          iVar1 = rnd_class(0x8f,0x92);
          mk_mplayer_armor(local_30,(short)iVar1);
        }
        iVar1 = rn2(8);
        if (iVar1 != 0) {
          iVar1 = rnd_class(0x93,0x9c);
          mk_mplayer_armor(local_30,(short)iVar1);
        }
        m_dowear(lev,local_30,'\x01');
        iVar1 = rn2(3);
        if (iVar1 == 0) {
          local_cc = rn2(0x10);
        }
        else {
          local_cc = rn2(3);
        }
        otmp._0_4_ = local_cc;
        while ((int)otmp != 0) {
          iVar1 = rnd_class(0x1f0,0x205);
          mongets(local_30,iVar1);
          otmp._0_4_ = (int)otmp + -1;
        }
        iVar1 = rn2(1000);
        mkmonmoney(local_30,(long)iVar1);
        otmp._0_4_ = rn2(10);
        while ((int)otmp != 0) {
          otmp_00 = mkobj(lev,'\0','\0');
          mpickobj(local_30,otmp_00);
          otmp._0_4_ = (int)otmp + -1;
        }
      }
      otmp._0_4_ = rnd(3);
      while ((int)otmp != 0) {
        iVar1 = rnd_offensive_item(local_30);
        mongets(local_30,iVar1);
        otmp._0_4_ = (int)otmp + -1;
      }
      otmp._0_4_ = rnd(3);
      while ((int)otmp != 0) {
        iVar1 = rnd_defensive_item(local_30);
        mongets(local_30,iVar1);
        otmp._0_4_ = (int)otmp + -1;
      }
      otmp._0_4_ = rnd(3);
      while ((int)otmp != 0) {
        iVar1 = rnd_misc_item(local_30);
        mongets(local_30,iVar1);
        otmp._0_4_ = (int)otmp + -1;
      }
    }
    ptr_local = (permonst *)local_30;
  }
  return (monst *)ptr_local;
}

Assistant:

struct monst *mk_mplayer(const struct permonst *ptr,
			 struct level *lev, xchar x, xchar y, boolean special)
{
	struct monst *mtmp;
	char nam[PL_NSIZ];

	if (!is_mplayer(ptr))
		return NULL;

	if (MON_AT(lev, x, y))
		rloc(lev, m_at(lev, x, y), FALSE); /* insurance */

	if (!In_endgame(&u.uz)) special = FALSE;

	if ((mtmp = makemon(ptr, lev, x, y, NO_MM_FLAGS)) != 0) {
	    short weapon = rn2(2) ? LONG_SWORD : rnd_class(SPEAR, BULLWHIP);
	    short armor = rnd_class(GRAY_DRAGON_SCALE_MAIL, YELLOW_DRAGON_SCALE_MAIL);
	    short cloak = !rn2(8) ? STRANGE_OBJECT :
	    		rnd_class(OILSKIN_CLOAK, CLOAK_OF_DISPLACEMENT);
	    short helm = !rn2(8) ? STRANGE_OBJECT :
	    		rnd_class(ELVEN_LEATHER_HELM, HELM_OF_TELEPATHY);
	    short shield = !rn2(8) ? STRANGE_OBJECT :
	    		rnd_class(ELVEN_SHIELD, SHIELD_OF_REFLECTION);
	    int quan;
	    struct obj *otmp;

	    mtmp->m_lev = (special ? rn1(16,15) : rnd(16));
	    mtmp->mhp = mtmp->mhpmax = dice((int)mtmp->m_lev,10) +
					(special ? (30 + rnd(30)) : 30);
	    if (special) {
	        get_mplname(mtmp, nam);
	        mtmp = christen_monst(mtmp, nam);
		/* that's why they are "stuck" in the endgame :-) */
		mongets(mtmp, FAKE_AMULET_OF_YENDOR);
	    }
	    mtmp->mpeaceful = 0;
	    set_malign(mtmp); /* peaceful may have changed again */

	    switch (monsndx(ptr)) {
		case PM_ARCHEOLOGIST:
		    if (rn2(2)) weapon = BULLWHIP;
		    break;
		case PM_BARBARIAN:
		    if (rn2(2)) {
		    	weapon = rn2(2) ? TWO_HANDED_SWORD : BATTLE_AXE;
		    	shield = STRANGE_OBJECT;
		    }
		    if (rn2(2)) armor = rnd_class(PLATE_MAIL, CHAIN_MAIL);
		    if (helm == HELM_OF_BRILLIANCE) helm = STRANGE_OBJECT;
		    break;
		case PM_CAVEMAN:
		case PM_CAVEWOMAN:
		    if (rn2(4)) weapon = MACE;
		    else if (rn2(2)) weapon = CLUB;
		    if (helm == HELM_OF_BRILLIANCE) helm = STRANGE_OBJECT;
		    break;
		case PM_CONVICT:
		    /* Defaults are just fine. */
		    break;
		case PM_HEALER:
		    if (rn2(4)) weapon = QUARTERSTAFF;
		    else if (rn2(2)) weapon = rn2(2) ? UNICORN_HORN : SCALPEL;
		    if (rn2(4)) helm = rn2(2) ? HELM_OF_BRILLIANCE : HELM_OF_TELEPATHY;
		    if (rn2(2)) shield = STRANGE_OBJECT;
		    break;
		case PM_KNIGHT:
		    if (rn2(4)) weapon = LONG_SWORD;
		    if (rn2(2)) armor = rnd_class(PLATE_MAIL, CHAIN_MAIL);
		    break;
		case PM_MONK:
		    weapon = STRANGE_OBJECT;
		    armor = STRANGE_OBJECT;
		    cloak = ROBE;
		    if (rn2(2)) shield = STRANGE_OBJECT;
		    break;
		case PM_PRIEST:
		case PM_PRIESTESS:
		    if (rn2(2)) weapon = MACE;
		    if (rn2(2)) armor = rnd_class(PLATE_MAIL, CHAIN_MAIL);
		    if (rn2(4)) cloak = ROBE;
		    if (rn2(4)) helm = rn2(2) ? HELM_OF_BRILLIANCE : HELM_OF_TELEPATHY;
		    if (rn2(2)) shield = STRANGE_OBJECT;
		    break;
		case PM_RANGER:
		    if (rn2(2)) weapon = ELVEN_DAGGER;
		    break;
		case PM_ROGUE:
		    if (rn2(2)) weapon = SHORT_SWORD;
		    break;
		case PM_SAMURAI:
		    if (rn2(2)) weapon = KATANA;
		    break;
		case PM_TOURIST:
		    /* Defaults are just fine */
		    break;
		case PM_VALKYRIE:
		    if (rn2(2)) weapon = WAR_HAMMER;
		    if (rn2(2)) armor = rnd_class(PLATE_MAIL, CHAIN_MAIL);
		    break;
		case PM_WIZARD:
		    if (rn2(4)) weapon = rn2(2) ? QUARTERSTAFF : ATHAME;
		    if (rn2(2)) {
		    	armor = rn2(2) ? BLACK_DRAGON_SCALE_MAIL :
		    			SILVER_DRAGON_SCALE_MAIL;
		    	cloak = CLOAK_OF_MAGIC_RESISTANCE;
		    }
		    if (rn2(4)) helm = HELM_OF_BRILLIANCE;
		    shield = STRANGE_OBJECT;
		    break;
		default:
		    warning("bad mplayer monster: %d", monsndx(ptr));
		    weapon = 0;
		    break;
	    }

	    if (weapon != STRANGE_OBJECT) {
		otmp = mksobj(lev, weapon, TRUE, FALSE);
		otmp->spe = (special ? rn1(5,4) : rn2(4));
		if (!rn2(3)) otmp->oerodeproof = 1;
		else if (!rn2(2)) otmp->greased = 1;
		if (special) {
		    if (!rn2(5))
			otmp = mk_artifact(lev, otmp, A_NONE);
		    else
			otmp = create_oprop(lev, otmp, FALSE);
		}
		/* mplayers knew better than to overenchant Magicbane */
		if (otmp->oartifact == ART_MAGICBANE)
		    otmp->spe = rnd(4);
		mpickobj(mtmp, otmp);
	    }

	    if (special) {
		if (!rn2(10))
		    mongets(mtmp, rn2(3) ? LUCKSTONE : LOADSTONE);
		mk_mplayer_armor(mtmp, armor);
		mk_mplayer_armor(mtmp, cloak);
		mk_mplayer_armor(mtmp, helm);
		mk_mplayer_armor(mtmp, shield);
		if (rn2(8))
		    mk_mplayer_armor(mtmp, rnd_class(LEATHER_GLOVES,
					       GAUNTLETS_OF_DEXTERITY));
		if (rn2(8))
		    mk_mplayer_armor(mtmp, rnd_class(LOW_BOOTS, LEVITATION_BOOTS));
		m_dowear(lev, mtmp, TRUE);

		quan = rn2(3) ? rn2(3) : rn2(16);
		while (quan--)
		    mongets(mtmp, rnd_class(DILITHIUM_CRYSTAL, JADE));
		/* To get the gold "right" would mean a player can double his */
		/* gold supply by killing one mplayer.  Not good. */
		mkmonmoney(mtmp, rn2(1000));
		quan = rn2(10);
		while (quan--)
		    mpickobj(mtmp, mkobj(lev, RANDOM_CLASS, FALSE));
	    }
	    quan = rnd(3);
	    while (quan--)
		mongets(mtmp, rnd_offensive_item(mtmp));
	    quan = rnd(3);
	    while (quan--)
		mongets(mtmp, rnd_defensive_item(mtmp));
	    quan = rnd(3);
	    while (quan--)
		mongets(mtmp, rnd_misc_item(mtmp));
	}

	return mtmp;
}